

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * cmGlobalNinjaGenerator::EncodeDepfileSpace(string *__return_storage_ptr__,string *path)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__," ","\\ ");
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodeDepfileSpace(const std::string &path)
{
  std::string result = path;
  cmSystemTools::ReplaceString(result, " ", "\\ ");
  return result;
}